

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthSwapAdjacentVars2(uint *pIn,uint *pOut,int nVars,int Start)

{
  int iVar1;
  int local_34;
  int local_2c;
  int Step;
  int k;
  int i;
  int nWords;
  int Start_local;
  int nVars_local;
  uint *pOut_local;
  uint *pIn_local;
  
  if (nVars < 6) {
    local_34 = 1;
  }
  else {
    local_34 = 1 << ((char)nVars - 5U & 0x1f);
  }
  if (nVars + -1 <= Start) {
    __assert_fail("Start < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0xb0,
                  "void Extra_TruthSwapAdjacentVars2(unsigned int *, unsigned int *, int, int)");
  }
  switch(Start) {
  case 0:
    for (Step = 0; Step < local_34; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0x99999999 | (pIn[Step] & 0x22222222) << 1 |
                   (pIn[Step] & 0x44444444) >> 1;
    }
    break;
  case 1:
    for (Step = 0; Step < local_34; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xc3c3c3c3 | (pIn[Step] & 0xc0c0c0c) << 2 |
                   (pIn[Step] & 0x30303030) >> 2;
    }
    break;
  case 2:
    for (Step = 0; Step < local_34; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xf00ff00f | (pIn[Step] & 0xf000f0) << 4 |
                   (pIn[Step] & 0xf000f00) >> 4;
    }
    break;
  case 3:
    for (Step = 0; Step < local_34; Step = Step + 1) {
      pOut[Step] = pIn[Step] & 0xff0000ff | (pIn[Step] & 0xff00) << 8 | (pIn[Step] & 0xff0000) >> 8;
    }
    break;
  case 4:
    for (Step = 0; Step < local_34; Step = Step + 2) {
      pOut[Step] = pIn[Step] & 0xffff | pIn[Step + 1] << 0x10;
      pOut[Step + 1] = pIn[Step + 1] & 0xffff0000 | pIn[Step] >> 0x10;
    }
    break;
  default:
    iVar1 = 1 << ((char)Start - 5U & 0x1f);
    _Start_local = pOut;
    pOut_local = pIn;
    for (local_2c = 0; local_2c < local_34; local_2c = iVar1 * 4 + local_2c) {
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        _Start_local[Step] = pOut_local[Step];
      }
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        _Start_local[iVar1 + Step] = pOut_local[iVar1 * 2 + Step];
      }
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        _Start_local[iVar1 * 2 + Step] = pOut_local[iVar1 + Step];
      }
      for (Step = 0; Step < iVar1; Step = Step + 1) {
        _Start_local[iVar1 * 3 + Step] = pOut_local[iVar1 * 3 + Step];
      }
      pOut_local = pOut_local + (iVar1 << 2);
      _Start_local = _Start_local + (iVar1 << 2);
    }
  }
  return;
}

Assistant:

void Extra_TruthSwapAdjacentVars2( unsigned * pIn, unsigned * pOut, int nVars, int Start )
{
    int nWords = (nVars <= 5)? 1 : (1 << (nVars-5));
    int i, k, Step;

    assert( Start < nVars - 1 );
    switch ( Start )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x99999999) | ((pIn[i] & 0x22222222) << 1) | ((pIn[i] & 0x44444444) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xC3C3C3C3) | ((pIn[i] & 0x0C0C0C0C) << 2) | ((pIn[i] & 0x30303030) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xF00FF00F) | ((pIn[i] & 0x00F000F0) << 4) | ((pIn[i] & 0x0F000F00) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFF0000FF) | ((pIn[i] & 0x0000FF00) << 8) | ((pIn[i] & 0x00FF0000) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
        return;
    default:
        Step = (1 << (Start - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
        return;
    }
}